

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_primitive_hasOverrideDispatch
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  puVar1 = (ulong *)*arguments;
  if (((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) {
    uVar2 = *puVar1;
    if (((uVar2 & 0xf) == 0 && uVar2 != 0) && ((*(byte *)(uVar2 + 8) & 0x80) == 0)) {
      uVar2 = *(ulong *)(uVar2 + 0x70);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar4 = (uint)((long)uVar2 >> 4);
      }
      else {
        uVar4 = (uint)*(undefined8 *)(uVar2 + 0x10);
      }
    }
    else {
      uVar4 = 0;
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      uVar2 = puVar1[5];
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        bVar3 = (byte)((long)uVar2 >> 4);
      }
      else {
        bVar3 = (byte)*(undefined8 *)(uVar2 + 0x10);
      }
      goto LAB_00113368;
    }
  }
  bVar3 = 0;
LAB_00113368:
  return (ulong)(bVar3 >> 7) << 4 | 0xf;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_hasOverrideDispatch(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    size_t flags = sysbvm_function_getFlags(context, *function);
    return sysbvm_tuple_boolean_encode((flags & SYSBVM_FUNCTION_FLAGS_OVERRIDE) != 0);
}